

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadPathArray
          (CrateReader *this,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  pointer pPVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  size_t nbytes;
  size_t __n;
  ostringstream oVar11;
  uint64_t n;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> ivalue;
  optional<tinyusdz::Path> pv;
  ostringstream ss_e;
  uint64_t local_300;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  string *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> local_2b8;
  long *local_2a0;
  long local_290 [2];
  ostringstream local_280;
  undefined7 uStack_27f;
  Path local_278;
  ostringstream local_1a8 [8];
  undefined1 local_1a0 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [12];
  
  local_2f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300 = 0;
  bVar4 = StreamReader::read8(this->_sr,&local_300);
  if (bVar4) {
    if ((this->_config).maxArrayElements < local_300) {
      ::std::__cxx11::string::append((char *)&this->_err);
    }
    else {
      uVar5 = local_300 * 4 + this->_memoryUsage;
      this->_memoryUsage = uVar5;
      if ((this->_config).maxMemoryBudget < uVar5) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x46d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar10 = "Reached to max memory budget.";
        lVar9 = 0x1d;
        goto LAB_001b776f;
      }
      ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
                (&local_2b8,local_300,(allocator_type *)local_1a8);
      pSVar1 = this->_sr;
      uVar2 = pSVar1->idx_;
      __n = pSVar1->length_ - uVar2;
      if (uVar2 + local_300 * 4 <= pSVar1->length_) {
        __n = local_300 << 2;
      }
      if (__n - 1 < local_300 << 2) {
        memcpy(local_2b8.
               super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
               _M_impl.super__Vector_impl_data._M_start,pSVar1->binary_ + uVar2,__n);
        pSVar1->idx_ = pSVar1->idx_ + __n;
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize(&local_2f8,local_300)
        ;
        if (local_300 == 0) {
          oVar11 = (ostringstream)0x1;
        }
        else {
          local_2d8 = local_f0;
          local_2e0 = &local_110;
          local_2d0 = &this->_err;
          local_2c0 = &local_278._element.field_2;
          local_2c8 = &local_278._variant_part_str.field_2;
          lVar9 = 0;
          uVar5 = 0;
          do {
            uVar7 = (ulong)local_2b8.
                           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5].value;
            pPVar3 = (this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = ((long)(this->_paths).
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4) *
                    0x4ec4ec4ec4ec4ec5;
            if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
              local_280 = (ostringstream)0x0;
            }
            else {
              local_1a8[0] = (ostringstream)0x1;
              Path::Path((Path *)local_1a0,pPVar3 + uVar7);
              local_280 = local_1a8[0];
              if (((byte)local_1a8[0] & 1) != 0) {
                Path::Path(&local_278,(Path *)local_1a0);
              }
              if (((byte)local_1a8[0] & 1) != 0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_p != local_2d8) {
                  operator_delete(local_100._M_p,local_f0[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_p != local_2e0) {
                  operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._96_8_ != &local_130) {
                  operator_delete((void *)local_1a0._96_8_,local_130._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_1a0._64_8_ != local_1a0 + 0x50) {
                  operator_delete((void *)local_1a0._64_8_,local_1a0._80_8_ + 1);
                }
                if ((undefined1 *)local_1a0._32_8_ != local_1a0 + 0x30) {
                  operator_delete((void *)local_1a0._32_8_,local_1a0._48_8_ + 1);
                }
                if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
                  operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
                }
              }
            }
            oVar11 = local_280;
            if (local_280 == (ostringstream)0x1) {
              Path::operator=((Path *)((long)&((local_2f8.
                                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _prim_part)._M_dataplus._M_p + lVar9),&local_278);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"operator()",10);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x47e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid Index for Path.",0x17);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)local_2d0,(ulong)local_2a0);
              if (local_2a0 != local_290) {
                operator_delete(local_2a0,local_290[0] + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x68));
            }
            if (local_280 == (ostringstream)0x1) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._element._M_dataplus._M_p != local_2c0) {
                operator_delete(local_278._element._M_dataplus._M_p,
                                local_278._element.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._variant_part_str._M_dataplus._M_p != local_2c8) {
                operator_delete(local_278._variant_part_str._M_dataplus._M_p,
                                local_278._variant_part_str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._variant_selection_part._M_dataplus._M_p !=
                  &local_278._variant_selection_part.field_2) {
                operator_delete(local_278._variant_selection_part._M_dataplus._M_p,
                                local_278._variant_selection_part.field_2._M_allocated_capacity + 1)
                ;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._variant_part._M_dataplus._M_p != &local_278._variant_part.field_2) {
                operator_delete(local_278._variant_part._M_dataplus._M_p,
                                local_278._variant_part.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._prop_part._M_dataplus._M_p != &local_278._prop_part.field_2) {
                operator_delete(local_278._prop_part._M_dataplus._M_p,
                                local_278._prop_part.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._prim_part._M_dataplus._M_p != &local_278._prim_part.field_2) {
                operator_delete(local_278._prim_part._M_dataplus._M_p,
                                local_278._prim_part.field_2._M_allocated_capacity + 1);
              }
            }
            if (oVar11 == (ostringstream)0x0) break;
            uVar5 = uVar5 + 1;
            lVar9 = lVar9 + 0xd0;
          } while (uVar5 < local_300);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
        oVar11 = (ostringstream)0x0;
      }
      if (local_2b8.
          super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (oVar11 != (ostringstream)0x0) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)d,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_2f8);
        bVar4 = true;
        goto LAB_001b780f;
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x464);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar10 = "Failed to read the number of array elements.";
    lVar9 = 0x2c;
LAB_001b776f:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,CONCAT71(uStack_27f,local_280));
    if ((size_type *)CONCAT71(uStack_27f,local_280) != &local_278._prim_part._M_string_length) {
      operator_delete((undefined1 *)CONCAT71(uStack_27f,local_280),
                      local_278._prim_part._M_string_length + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x68));
  }
  ::std::__cxx11::string::append((char *)&this->_err);
  bVar4 = false;
LAB_001b780f:
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_2f8);
  return bVar4;
}

Assistant:

bool CrateReader::ReadPathArray(std::vector<Path> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<Path> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many Path array elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      _err += "Failed to read ListOp data.\n";
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto pv = GetPath(ivalue[i])) {
        result[i] = pv.value();
      } else {
        PUSH_ERROR("Invalid Index for Path.");
        return false;
      }
    }

    return true;
  };

  std::vector<Path> items;
  if (!ReadFn(items)) {
    _err += "Failed to read Path vector.\n";
    return false;
  }

  (*d) = items;

  return true;
}